

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_fill(Integer g_a,void *val)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  Integer I_elems;
  char err_string [256];
  long local_140;
  char *local_138 [33];
  
  iVar5 = _ga_sync_end;
  bVar12 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  iVar1 = GA[g_a + 1000].p_handle;
  if (bVar12) {
    pnga_pgroup_sync((long)iVar1);
  }
  if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","ga_fill");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[g_a + 1000].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","ga_fill");
    pnga_error((char *)local_138,g_a);
  }
  iVar6 = (int)g_a + 1000;
  uVar7 = GA[iVar6].type - 1000;
  if ((0xff < uVar7) || (ga_types[uVar7].active == 0)) {
    pnga_error("type not yet supported",(long)GA[iVar6].type);
  }
  auVar4 = _DAT_001b19e0;
  lVar8 = GA[iVar6].size / (long)GA[iVar6].elemsize;
  if (GA[iVar6].block_total < 0) {
    lVar10 = GAme;
    if (-1 < iVar1) {
      lVar10 = (long)PGRP_LIST[GA[iVar6].p_handle].map_proc_list[GAme];
    }
    local_138[0] = GA[iVar6].ptr[lVar10];
    switch(GA[iVar6].type) {
    case 0x3e9:
      if (0 < lVar8) {
        uVar2 = *val;
        lVar10 = lVar8 + -1;
        auVar14._8_4_ = (int)lVar10;
        auVar14._0_8_ = lVar10;
        auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar9 = 0;
        auVar14 = auVar14 ^ _DAT_001b19e0;
        auVar20 = _DAT_001b2d20;
        auVar29 = _DAT_001b1a00;
        do {
          auVar35 = auVar29 ^ auVar4;
          iVar6 = auVar14._4_4_;
          if ((bool)(~(auVar35._4_4_ == iVar6 && auVar14._0_4_ < auVar35._0_4_ ||
                      iVar6 < auVar35._4_4_) & 1)) {
            *(undefined4 *)(local_138[0] + uVar9 * 4) = uVar2;
          }
          if ((auVar35._12_4_ != auVar14._12_4_ || auVar35._8_4_ <= auVar14._8_4_) &&
              auVar35._12_4_ <= auVar14._12_4_) {
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 4) = uVar2;
          }
          iVar37 = SUB164(auVar20 ^ auVar4,4);
          if (iVar37 <= iVar6 && (iVar37 != iVar6 || SUB164(auVar20 ^ auVar4,0) <= auVar14._0_4_)) {
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 8) = uVar2;
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 0xc) = uVar2;
          }
          uVar9 = uVar9 + 4;
          lVar10 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 4;
          auVar29._8_8_ = lVar10 + 4;
          lVar10 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 4;
          auVar20._8_8_ = lVar10 + 4;
        } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar9);
      }
      break;
    case 0x3ea:
      if (0 < lVar8) {
        uVar3 = *val;
        lVar10 = lVar8 + -1;
        auVar17._8_4_ = (int)lVar10;
        auVar17._0_8_ = lVar10;
        auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar9 = 0;
        auVar17 = auVar17 ^ _DAT_001b19e0;
        auVar25 = _DAT_001b1a00;
        do {
          auVar35 = auVar25 ^ auVar4;
          if ((bool)(~(auVar35._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar35._0_4_ ||
                      auVar17._4_4_ < auVar35._4_4_) & 1)) {
            *(undefined8 *)(local_138[0] + uVar9 * 8) = uVar3;
          }
          if ((auVar35._12_4_ != auVar17._12_4_ || auVar35._8_4_ <= auVar17._8_4_) &&
              auVar35._12_4_ <= auVar17._12_4_) {
            *(undefined8 *)(local_138[0] + uVar9 * 8 + 8) = uVar3;
          }
          uVar9 = uVar9 + 2;
          lVar10 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 2;
          auVar25._8_8_ = lVar10 + 2;
        } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar9);
      }
      break;
    case 0x3eb:
      if (0 < lVar8) {
        uVar2 = *val;
        lVar10 = lVar8 + -1;
        auVar26._8_4_ = (int)lVar10;
        auVar26._0_8_ = lVar10;
        auVar26._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar9 = 0;
        auVar26 = auVar26 ^ _DAT_001b19e0;
        auVar32 = _DAT_001b2d20;
        auVar34 = _DAT_001b1a00;
        do {
          auVar35 = auVar34 ^ auVar4;
          iVar6 = auVar26._4_4_;
          if ((bool)(~(auVar35._4_4_ == iVar6 && auVar26._0_4_ < auVar35._0_4_ ||
                      iVar6 < auVar35._4_4_) & 1)) {
            *(undefined4 *)(local_138[0] + uVar9 * 4) = uVar2;
          }
          if ((auVar35._12_4_ != auVar26._12_4_ || auVar35._8_4_ <= auVar26._8_4_) &&
              auVar35._12_4_ <= auVar26._12_4_) {
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 4) = uVar2;
          }
          iVar37 = SUB164(auVar32 ^ auVar4,4);
          if (iVar37 <= iVar6 && (iVar37 != iVar6 || SUB164(auVar32 ^ auVar4,0) <= auVar26._0_4_)) {
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 8) = uVar2;
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 0xc) = uVar2;
          }
          uVar9 = uVar9 + 4;
          lVar10 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 4;
          auVar34._8_8_ = lVar10 + 4;
          lVar10 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 4;
          auVar32._8_8_ = lVar10 + 4;
        } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar9);
      }
      break;
    case 0x3ec:
      if (0 < lVar8) {
        uVar3 = *val;
        lVar10 = lVar8 + -1;
        auVar27._8_4_ = (int)lVar10;
        auVar27._0_8_ = lVar10;
        auVar27._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar9 = 0;
        auVar27 = auVar27 ^ _DAT_001b19e0;
        auVar36 = _DAT_001b1a00;
        do {
          auVar35 = auVar36 ^ auVar4;
          if ((bool)(~(auVar35._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar35._0_4_ ||
                      auVar27._4_4_ < auVar35._4_4_) & 1)) {
            *(undefined8 *)(local_138[0] + uVar9 * 8) = uVar3;
          }
          if ((auVar35._12_4_ != auVar27._12_4_ || auVar35._8_4_ <= auVar27._8_4_) &&
              auVar35._12_4_ <= auVar27._12_4_) {
            *(undefined8 *)(local_138[0] + uVar9 * 8 + 8) = uVar3;
          }
          uVar9 = uVar9 + 2;
          lVar10 = auVar36._8_8_;
          auVar36._0_8_ = auVar36._0_8_ + 2;
          auVar36._8_8_ = lVar10 + 2;
        } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar9);
      }
      break;
    default:
      pnga_error("type not supported",(long)GA[iVar6].type);
      break;
    case 0x3ee:
      if (0 < lVar8) {
        lVar10 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar10 * 8) = *val;
          lVar10 = lVar10 + 1;
        } while (lVar8 != lVar10);
      }
      break;
    case 0x3ef:
      pcVar11 = local_138[0];
      if (0 < lVar8) {
        do {
          uVar3 = *(undefined8 *)((long)val + 8);
          *(undefined8 *)pcVar11 = *val;
          *(undefined8 *)(pcVar11 + 8) = uVar3;
          pcVar11 = pcVar11 + 0x10;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      break;
    case 0x3f8:
      if (0 < lVar8) {
        uVar3 = *val;
        lVar10 = lVar8 + -1;
        auVar18._8_4_ = (int)lVar10;
        auVar18._0_8_ = lVar10;
        auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar9 = 0;
        auVar18 = auVar18 ^ _DAT_001b19e0;
        auVar35 = _DAT_001b1a00;
        do {
          auVar36 = auVar35 ^ auVar4;
          if ((bool)(~(auVar36._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar36._0_4_ ||
                      auVar18._4_4_ < auVar36._4_4_) & 1)) {
            *(undefined8 *)(local_138[0] + uVar9 * 8) = uVar3;
          }
          if ((auVar36._12_4_ != auVar18._12_4_ || auVar36._8_4_ <= auVar18._8_4_) &&
              auVar36._12_4_ <= auVar18._12_4_) {
            *(undefined8 *)(local_138[0] + uVar9 * 8 + 8) = uVar3;
          }
          uVar9 = uVar9 + 2;
          lVar10 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + 2;
          auVar35._8_8_ = lVar10 + 2;
        } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar9);
      }
    }
  }
  else {
    local_140 = lVar8;
    pnga_access_block_segment_ptr(g_a,GAme,local_138,&local_140);
    auVar4 = _DAT_001b19e0;
    switch(GA[iVar6].type) {
    case 0x3e9:
      if (0 < local_140) {
        uVar2 = *val;
        lVar8 = local_140 + -1;
        auVar13._8_4_ = (int)lVar8;
        auVar13._0_8_ = lVar8;
        auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar13 = auVar13 ^ _DAT_001b19e0;
        auVar19 = _DAT_001b2d20;
        auVar28 = _DAT_001b1a00;
        do {
          auVar35 = auVar28 ^ auVar4;
          iVar6 = auVar13._4_4_;
          if ((bool)(~(auVar35._4_4_ == iVar6 && auVar13._0_4_ < auVar35._0_4_ ||
                      iVar6 < auVar35._4_4_) & 1)) {
            *(undefined4 *)(local_138[0] + uVar9 * 4) = uVar2;
          }
          if ((auVar35._12_4_ != auVar13._12_4_ || auVar35._8_4_ <= auVar13._8_4_) &&
              auVar35._12_4_ <= auVar13._12_4_) {
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 4) = uVar2;
          }
          iVar37 = SUB164(auVar19 ^ auVar4,4);
          if (iVar37 <= iVar6 && (iVar37 != iVar6 || SUB164(auVar19 ^ auVar4,0) <= auVar13._0_4_)) {
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 8) = uVar2;
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 0xc) = uVar2;
          }
          uVar9 = uVar9 + 4;
          lVar8 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 4;
          auVar28._8_8_ = lVar8 + 4;
          lVar8 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 4;
          auVar19._8_8_ = lVar8 + 4;
        } while ((local_140 + 3U & 0xfffffffffffffffc) != uVar9);
      }
      break;
    case 0x3ea:
      if (0 < local_140) {
        uVar3 = *val;
        lVar8 = local_140 + -1;
        auVar15._8_4_ = (int)lVar8;
        auVar15._0_8_ = lVar8;
        auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar15 = auVar15 ^ _DAT_001b19e0;
        auVar21 = _DAT_001b1a00;
        do {
          auVar35 = auVar21 ^ auVar4;
          if ((bool)(~(auVar35._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar35._0_4_ ||
                      auVar15._4_4_ < auVar35._4_4_) & 1)) {
            *(undefined8 *)(local_138[0] + uVar9 * 8) = uVar3;
          }
          if ((auVar35._12_4_ != auVar15._12_4_ || auVar35._8_4_ <= auVar15._8_4_) &&
              auVar35._12_4_ <= auVar15._12_4_) {
            *(undefined8 *)(local_138[0] + uVar9 * 8 + 8) = uVar3;
          }
          uVar9 = uVar9 + 2;
          lVar8 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 2;
          auVar21._8_8_ = lVar8 + 2;
        } while ((local_140 + 1U & 0xfffffffffffffffe) != uVar9);
      }
      break;
    case 0x3eb:
      if (0 < local_140) {
        uVar2 = *val;
        lVar8 = local_140 + -1;
        auVar23._8_4_ = (int)lVar8;
        auVar23._0_8_ = lVar8;
        auVar23._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar23 = auVar23 ^ _DAT_001b19e0;
        auVar30 = _DAT_001b2d20;
        auVar33 = _DAT_001b1a00;
        do {
          auVar35 = auVar33 ^ auVar4;
          iVar6 = auVar23._4_4_;
          if ((bool)(~(auVar35._4_4_ == iVar6 && auVar23._0_4_ < auVar35._0_4_ ||
                      iVar6 < auVar35._4_4_) & 1)) {
            *(undefined4 *)(local_138[0] + uVar9 * 4) = uVar2;
          }
          if ((auVar35._12_4_ != auVar23._12_4_ || auVar35._8_4_ <= auVar23._8_4_) &&
              auVar35._12_4_ <= auVar23._12_4_) {
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 4) = uVar2;
          }
          iVar37 = SUB164(auVar30 ^ auVar4,4);
          if (iVar37 <= iVar6 && (iVar37 != iVar6 || SUB164(auVar30 ^ auVar4,0) <= auVar23._0_4_)) {
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 8) = uVar2;
            *(undefined4 *)(local_138[0] + uVar9 * 4 + 0xc) = uVar2;
          }
          uVar9 = uVar9 + 4;
          lVar8 = auVar33._8_8_;
          auVar33._0_8_ = auVar33._0_8_ + 4;
          auVar33._8_8_ = lVar8 + 4;
          lVar8 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 4;
          auVar30._8_8_ = lVar8 + 4;
        } while ((local_140 + 3U & 0xfffffffffffffffc) != uVar9);
      }
      break;
    case 0x3ec:
      if (0 < local_140) {
        uVar3 = *val;
        lVar8 = local_140 + -1;
        auVar24._8_4_ = (int)lVar8;
        auVar24._0_8_ = lVar8;
        auVar24._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar24 = auVar24 ^ _DAT_001b19e0;
        auVar31 = _DAT_001b1a00;
        do {
          auVar35 = auVar31 ^ auVar4;
          if ((bool)(~(auVar35._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar35._0_4_ ||
                      auVar24._4_4_ < auVar35._4_4_) & 1)) {
            *(undefined8 *)(local_138[0] + uVar9 * 8) = uVar3;
          }
          if ((auVar35._12_4_ != auVar24._12_4_ || auVar35._8_4_ <= auVar24._8_4_) &&
              auVar35._12_4_ <= auVar24._12_4_) {
            *(undefined8 *)(local_138[0] + uVar9 * 8 + 8) = uVar3;
          }
          uVar9 = uVar9 + 2;
          lVar8 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 2;
          auVar31._8_8_ = lVar8 + 2;
        } while ((local_140 + 1U & 0xfffffffffffffffe) != uVar9);
      }
      break;
    default:
      pnga_error("type not supported",(long)GA[iVar6].type);
      break;
    case 0x3ee:
      if (0 < local_140) {
        lVar8 = 0;
        do {
          *(undefined8 *)(local_138[0] + lVar8 * 8) = *val;
          lVar8 = lVar8 + 1;
        } while (local_140 != lVar8);
      }
      break;
    case 0x3ef:
      lVar8 = local_140;
      pcVar11 = local_138[0];
      if (0 < local_140) {
        do {
          uVar3 = *(undefined8 *)((long)val + 8);
          *(undefined8 *)pcVar11 = *val;
          *(undefined8 *)(pcVar11 + 8) = uVar3;
          lVar8 = lVar8 + -1;
          pcVar11 = pcVar11 + 0x10;
        } while (lVar8 != 0);
      }
      break;
    case 0x3f8:
      if (0 < local_140) {
        uVar3 = *val;
        lVar8 = local_140 + -1;
        auVar16._8_4_ = (int)lVar8;
        auVar16._0_8_ = lVar8;
        auVar16._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar16 = auVar16 ^ _DAT_001b19e0;
        auVar22 = _DAT_001b1a00;
        do {
          auVar35 = auVar22 ^ auVar4;
          if ((bool)(~(auVar35._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar35._0_4_ ||
                      auVar16._4_4_ < auVar35._4_4_) & 1)) {
            *(undefined8 *)(local_138[0] + uVar9 * 8) = uVar3;
          }
          if ((auVar35._12_4_ != auVar16._12_4_ || auVar35._8_4_ <= auVar16._8_4_) &&
              auVar35._12_4_ <= auVar16._12_4_) {
            *(undefined8 *)(local_138[0] + uVar9 * 8 + 8) = uVar3;
          }
          uVar9 = uVar9 + 2;
          lVar8 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 2;
          auVar22._8_8_ = lVar8 + 2;
        } while ((local_140 + 1U & 0xfffffffffffffffe) != uVar9);
      }
    }
    pnga_release_block_segment(g_a,GAme);
  }
  if (iVar5 != 0) {
    pnga_pgroup_sync((long)iVar1);
  }
  return;
}

Assistant:

void pnga_fill(Integer g_a, void* val)
{
  int i,handle=GA_OFFSET + (int)g_a;
  char *ptr;
  int local_sync_begin,local_sync_end;
  C_Long elems;
  Integer grp_id;
  Integer num_blocks;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);


  ga_check_handleM(g_a, "ga_fill");
  gam_checktype(GA[handle].type);
  elems = GA[handle].size/((C_Long)GA[handle].elemsize);
  num_blocks = GA[handle].block_total;

  if (num_blocks < 0) {
    /* Bruce..Please CHECK if this is correct */
    if (grp_id >= 0){  
      Integer grp_me = PGRP_LIST[GA[handle].p_handle].map_proc_list[GAme];
      ptr = GA[handle].ptr[grp_me];
    }
    else  ptr = GA[handle].ptr[GAme];

    switch (GA[handle].type){
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*( long long*)val;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
  } else {
    Integer I_elems = (Integer)elems;
    pnga_access_block_segment_ptr(g_a,GAme,&ptr,&I_elems);
    elems = (C_Long)I_elems;
    switch (GA[handle].type){
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*(long long*)val;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
    pnga_release_block_segment(g_a,GAme);
  }

  if(local_sync_end)pnga_pgroup_sync(grp_id);

}